

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

opj_image_t *
rawtoimage_common(char *filename,opj_cparameters_t *parameters,raw_cparameters_t *raw_cp,
                 OPJ_BOOL big_endian)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  undefined8 uVar7;
  raw_comp_cparameters_t *prVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  FILE *__stream;
  int *piVar12;
  opj_image_t *poVar13;
  size_t sVar14;
  int *piVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  ulong uVar19;
  uchar value;
  uchar temp2;
  uchar temp1;
  unsigned_short ch;
  byte local_63;
  byte local_62;
  byte local_61;
  int *local_60;
  raw_cparameters_t *local_58;
  int *local_50;
  int *local_48;
  undefined1 local_3a [2];
  opj_cparameters_t *local_38;
  
  local_48 = (int *)CONCAT44(local_48._4_4_,big_endian);
  local_58 = raw_cp;
  if ((raw_cp->rawBitDepth & raw_cp->rawHeight & raw_cp->rawComp & raw_cp->rawWidth) == 0) {
    iVar1 = parameters->subsampling_dx;
    iVar2 = parameters->subsampling_dy;
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      rawtoimage_common_cold_6();
    }
    else {
      uVar3 = local_58->rawComp;
      piVar17 = (int *)(ulong)uVar3;
      iVar11 = 2;
      if ((piVar17 != (int *)0x1) && (iVar11 = -1, 2 < (int)uVar3)) {
        iVar11 = 3;
        if (parameters->tcp_mct != '\0') {
          iVar11 = (uint)(parameters->tcp_mct != '\x02') * 2 + -1;
        }
      }
      local_60 = (int *)CONCAT44(local_60._4_4_,iVar11);
      iVar11 = local_58->rawWidth;
      uVar4 = local_58->rawHeight;
      local_38 = parameters;
      piVar12 = (int *)calloc((size_t)piVar17,0x24);
      if (piVar12 == (int *)0x0) {
        rawtoimage_common_cold_5();
      }
      else {
        if (0 < (int)uVar3) {
          uVar7._0_4_ = local_58->rawBitDepth;
          uVar7._4_4_ = local_58->rawSigned;
          prVar8 = local_58->rawComps;
          piVar15 = (int *)0x0;
          piVar18 = piVar12;
          do {
            piVar18[6] = (undefined4)uVar7;
            *(undefined8 *)(piVar18 + 7) = uVar7;
            *piVar18 = prVar8[(long)piVar15].dx * iVar1;
            piVar18[1] = prVar8[(long)piVar15].dy * iVar2;
            piVar18[2] = iVar11;
            piVar18[3] = uVar4;
            piVar15 = (int *)((long)piVar15 + 1);
            piVar18 = piVar18 + 9;
          } while (piVar17 != piVar15);
        }
        uVar16 = (ulong)local_60 & 0xffffffff;
        local_60 = piVar12;
        local_50 = piVar17;
        poVar13 = (opj_image_t *)opj_image_create(piVar17,piVar12,uVar16);
        free(local_60);
        if (poVar13 != (opj_image_t *)0x0) {
          OVar5 = local_38->image_offset_x0;
          poVar13->x0 = OVar5;
          OVar6 = local_38->image_offset_y0;
          poVar13->y0 = OVar6;
          poVar13->x1 = OVar5 + (iVar11 + -1) * iVar1 + 1;
          poVar13->y1 = (uVar4 - 1) * iVar2 + OVar6 + 1;
          if (local_58->rawBitDepth < 9) {
            local_63 = 0;
            local_60 = (int *)(ulong)uVar4;
            if (0 < (int)local_50) {
              local_60 = (int *)(ulong)(uVar4 * iVar11);
              piVar17 = (int *)0x0;
              do {
                uVar16 = (long)((ulong)(uint)((int)local_60 >> 0x1f) << 0x20 |
                               (ulong)local_60 & 0xffffffff) /
                         (long)(local_58->rawComps[(long)piVar17].dy *
                               local_58->rawComps[(long)piVar17].dx);
                local_48 = piVar17;
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    sVar14 = fread(&local_63,1,1,__stream);
                    if (sVar14 == 0) {
                      rawtoimage_common_cold_4();
                      return (opj_image_t *)0x0;
                    }
                    uVar3 = (int)(char)local_63;
                    if (local_58->rawSigned == 0) {
                      uVar3 = (uint)local_63;
                    }
                    poVar13->comps[(long)piVar17].data[uVar19] = uVar3;
                    uVar19 = uVar19 + 1;
                  } while ((uVar16 & 0xffffffff) != uVar19);
                }
                piVar17 = (int *)((long)local_48 + 1);
              } while (piVar17 != local_50);
            }
          }
          else {
            if (0x10 < (uint)local_58->rawBitDepth) {
              rawtoimage_common_cold_2();
              return (opj_image_t *)0x0;
            }
            if (0 < (int)local_50) {
              piVar17 = (int *)0x0;
              do {
                uVar16 = (long)(int)(uVar4 * iVar11) /
                         (long)(local_58->rawComps[(long)piVar17].dy *
                               local_58->rawComps[(long)piVar17].dx);
                local_60 = piVar17;
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    sVar14 = fread(&local_61,1,1,__stream);
                    if ((sVar14 == 0) || (sVar14 = fread(&local_62,1,1,__stream), sVar14 == 0)) {
                      fwrite("Error reading raw file. End of file probably reached.\n",0x36,1,
                             _stderr);
                      opj_image_destroy(poVar13);
                      goto LAB_0010b20b;
                    }
                    uVar9 = (ushort)local_61;
                    uVar10 = (ushort)local_62;
                    if ((int)local_48 == 0) {
                      uVar9 = (ushort)local_62;
                      uVar10 = (ushort)local_61;
                    }
                    uVar10 = uVar10 | uVar9 << 8;
                    uVar3 = (uint)uVar10;
                    if (local_58->rawSigned != 0) {
                      uVar3 = (int)(short)uVar10;
                    }
                    poVar13->comps[(long)piVar17].data[uVar19] = uVar3;
                    uVar19 = uVar19 + 1;
                  } while ((uVar16 & 0xffffffff) != uVar19);
                }
                piVar17 = (int *)((long)local_60 + 1);
              } while (piVar17 != local_50);
            }
          }
          sVar14 = fread(local_3a,1,1,__stream);
          if (sVar14 != 0) {
            rawtoimage_common_cold_3();
          }
          fclose(__stream);
          return poVar13;
        }
LAB_0010b20b:
        fclose(__stream);
      }
    }
  }
  else {
    rawtoimage_common_cold_1();
  }
  return (opj_image_t *)0x0;
}

Assistant:

static opj_image_t* rawtoimage_common(const char *filename,
                                      opj_cparameters_t *parameters, raw_cparameters_t *raw_cp, OPJ_BOOL big_endian)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *f = NULL;
    int i, compno, numcomps, w, h;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t *cmptparm;
    opj_image_t * image = NULL;
    unsigned short ch;

    if ((!(raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp &
            raw_cp->rawBitDepth)) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        fprintf(stderr, "Please use the Format option -F:\n");
        fprintf(stderr,
                "-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
        fprintf(stderr,
                "If subsampling is omitted, 1x1 is assumed for all components\n");
        fprintf(stderr,
                "Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
        fprintf(stderr, "         for raw 512x512 image with 4:2:0 subsampling\n");
        fprintf(stderr, "Aborting.\n");
        return NULL;
    }

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        fprintf(stderr, "Aborting\n");
        return NULL;
    }
    numcomps = raw_cp->rawComp;

    /* FIXME ADE at this point, tcp_mct has not been properly set in calling function */
    if (numcomps == 1) {
        color_space = OPJ_CLRSPC_GRAY;
    } else if ((numcomps >= 3) && (parameters->tcp_mct == 0)) {
        color_space = OPJ_CLRSPC_SYCC;
    } else if ((numcomps >= 3) && (parameters->tcp_mct != 2)) {
        color_space = OPJ_CLRSPC_SRGB;
    } else {
        color_space = OPJ_CLRSPC_UNKNOWN;
    }
    w = raw_cp->rawWidth;
    h = raw_cp->rawHeight;
    cmptparm = (opj_image_cmptparm_t*) calloc((OPJ_UINT32)numcomps,
               sizeof(opj_image_cmptparm_t));
    if (!cmptparm) {
        fprintf(stderr, "Failed to allocate image components parameters !!\n");
        fprintf(stderr, "Aborting\n");
        fclose(f);
        return NULL;
    }
    /* initialize image components */
    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].bpp = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].sgnd = (OPJ_UINT32)raw_cp->rawSigned;
        cmptparm[i].dx = (OPJ_UINT32)(subsampling_dx * raw_cp->rawComps[i].dx);
        cmptparm[i].dy = (OPJ_UINT32)(subsampling_dy * raw_cp->rawComps[i].dy);
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    free(cmptparm);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)parameters->image_offset_x0 + (OPJ_UINT32)(w - 1) *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = (OPJ_UINT32)parameters->image_offset_y0 + (OPJ_UINT32)(h - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    if (raw_cp->rawBitDepth <= 8) {
        unsigned char value = 0;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                if (!fread(&value, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (char)value : value;
            }
        }
    } else if (raw_cp->rawBitDepth <= 16) {
        unsigned short value;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                unsigned char temp1;
                unsigned char temp2;
                if (!fread(&temp1, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&temp2, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (big_endian) {
                    value = (unsigned short)((temp1 << 8) + temp2);
                } else {
                    value = (unsigned short)((temp2 << 8) + temp1);
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (short)value : value;
            }
        }
    } else {
        fprintf(stderr,
                "OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n");
        opj_image_destroy(image);
        fclose(f);
        return NULL;
    }

    if (fread(&ch, 1, 1, f)) {
        fprintf(stderr, "Warning. End of raw file not reached... processing anyway\n");
    }
    fclose(f);

    return image;
}